

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O1

void __thiscall
HecrSequential_constructMatrix_Test::~HecrSequential_constructMatrix_Test
          (HecrSequential_constructMatrix_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HecrSequential, constructMatrix)
{
    int nx = 10;
    int nt = 10;
    int size = 15;
    double a = -334.22778765548086862041428227;
    const double as_values[] = { a, a, a, a, a, a, a, a, a, 1, 1, 1, 1, 1, 1 };
    vec as = make_vector(size, as_values);
    double bc = 162.1138938277404343102071411;
    const double bs_values[] =
        { 0, bc, bc, bc, bc, bc, bc, bc, bc, 0, 0, 0, 0, 0, 0 };
    vec bs = make_vector(size, bs_values);
    const double cs_values[] =
        { bc, bc, bc, bc, bc, bc, bc, bc, 0, 0, 0, 0, 0, 0, 0 };
    vec cs = make_vector(size, cs_values);

    TridiagonalMatrix m = construct_matrix(nx, nt);

    EXPECT_EQ(size, m.size);
    EXPECT_LT(max_diff(m.as, as), EPS);
    EXPECT_LT(max_diff(m.bs, bs), EPS);
    EXPECT_LT(max_diff(m.cs, cs), EPS);
}